

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void aom_blend_a64_mask_avx2
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h,int subw,int subh
               )

{
  uint32_t in_ECX;
  uint8_t *in_RDX;
  uint32_t in_ESI;
  uint8_t *in_RDI;
  uint8_t *in_R8;
  uint32_t in_R9D;
  uint8_t *in_stack_00000008;
  uint32_t in_stack_00000010;
  uint in_stack_00000018;
  uint in_stack_00000020;
  uint in_stack_00000028;
  uint in_stack_00000030;
  uint32_t in_stack_0000006c;
  uint8_t *in_stack_00000070;
  uint32_t in_stack_0000007c;
  uint32_t in_stack_0000008c;
  undefined4 in_stack_00000094;
  uint32_t in_stack_0000009c;
  undefined4 in_stack_000000a4;
  uint32_t in_stack_000000cc;
  uint8_t *in_stack_000000d0;
  uint32_t in_stack_000000dc;
  uint8_t *in_stack_000000e0;
  uint32_t in_stack_000000ec;
  uint8_t *in_stack_000000f0;
  uint32_t in_stack_0000014c;
  uint8_t *in_stack_00000150;
  uint32_t in_stack_0000015c;
  uint8_t *in_stack_00000160;
  uint32_t in_stack_00000168;
  uint32_t in_stack_0000016c;
  int in_stack_00000170;
  undefined4 in_stack_00000174;
  int in_stack_00000178;
  uint8_t *in_stack_00000190;
  uint32_t in_stack_00000198;
  int in_stack_000001a0;
  int in_stack_000001a8;
  uint8_t *in_stack_000002a0;
  uint32_t in_stack_000002a8;
  int in_stack_000002b0;
  int in_stack_000002b8;
  uint8_t *in_stack_00000360;
  uint32_t in_stack_00000368;
  int in_stack_00000370;
  int in_stack_00000378;
  
  if (((in_stack_00000020 | in_stack_00000018) & 3) == 0) {
    if ((in_stack_00000028 & in_stack_00000030) == 0) {
      if (in_stack_00000028 == 0) {
        if (in_stack_00000030 == 0) {
          blend_a64_mask_avx2((uint8_t *)CONCAT44(in_stack_00000094,w),in_stack_0000008c,mask,
                              in_stack_0000007c,in_stack_00000070,in_stack_0000006c,
                              in_stack_00000160,in_stack_00000168,in_stack_00000170,
                              in_stack_00000178);
        }
        else {
          blend_a64_mask_sy_avx2
                    ((uint8_t *)CONCAT44(in_stack_000000a4,subw),in_stack_0000009c,
                     (uint8_t *)CONCAT44(in_stack_00000094,w),in_stack_0000008c,mask,
                     in_stack_0000007c,in_stack_00000190,in_stack_00000198,in_stack_000001a0,
                     in_stack_000001a8);
        }
      }
      else {
        blend_a64_mask_sx_avx2
                  (in_stack_000000f0,in_stack_000000ec,in_stack_000000e0,in_stack_000000dc,
                   in_stack_000000d0,in_stack_000000cc,in_stack_000002a0,in_stack_000002a8,
                   in_stack_000002b0,in_stack_000002b8);
      }
    }
    else {
      blend_a64_mask_sx_sy_avx2
                ((uint8_t *)CONCAT44(in_stack_00000174,in_stack_00000170),in_stack_0000016c,
                 in_stack_00000160,in_stack_0000015c,in_stack_00000150,in_stack_0000014c,
                 in_stack_00000360,in_stack_00000368,in_stack_00000370,in_stack_00000378);
    }
  }
  else {
    aom_blend_a64_mask_c
              (in_RDI,in_ESI,in_RDX,in_ECX,in_R8,in_R9D,in_stack_00000008,in_stack_00000010,
               in_stack_00000018,in_stack_00000020,in_stack_00000028,in_stack_00000030);
  }
  return;
}

Assistant:

void aom_blend_a64_mask_avx2(uint8_t *dst, uint32_t dst_stride,
                             const uint8_t *src0, uint32_t src0_stride,
                             const uint8_t *src1, uint32_t src1_stride,
                             const uint8_t *mask, uint32_t mask_stride, int w,
                             int h, int subw, int subh) {
  assert(IMPLIES(src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES(src1 == dst, src1_stride == dst_stride));

  assert(h >= 1);
  assert(w >= 1);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  if (UNLIKELY((h | w) & 3)) {  // if (w <= 2 || h <= 2)
    aom_blend_a64_mask_c(dst, dst_stride, src0, src0_stride, src1, src1_stride,
                         mask, mask_stride, w, h, subw, subh);
  } else {
    if (subw & subh) {
      blend_a64_mask_sx_sy_avx2(dst, dst_stride, src0, src0_stride, src1,
                                src1_stride, mask, mask_stride, w, h);
    } else if (subw) {
      blend_a64_mask_sx_avx2(dst, dst_stride, src0, src0_stride, src1,
                             src1_stride, mask, mask_stride, w, h);
    } else if (subh) {
      blend_a64_mask_sy_avx2(dst, dst_stride, src0, src0_stride, src1,
                             src1_stride, mask, mask_stride, w, h);
    } else {
      blend_a64_mask_avx2(dst, dst_stride, src0, src0_stride, src1, src1_stride,
                          mask, mask_stride, w, h);
    }
  }
}